

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QPointF *pos,QPixmap *pixmap)

{
  QPaintEngineState *pQVar1;
  int iVar2;
  TransformationType TVar3;
  QPlatformPixmap *pQVar4;
  QRasterBuffer *pQVar5;
  QPaintEngineState *pQVar6;
  long in_FS_OFFSET;
  QColor QVar7;
  undefined1 local_78 [16];
  QImageData *local_68;
  QColor local_58;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QRasterBuffer *)pos;
  pQVar4 = QPixmap::handle(pixmap);
  if (pQVar4->id == 0) {
    pQVar4 = pQVar4 + 1;
    iVar2 = QImage::depth((QImage *)pQVar4);
    if (iVar2 != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        drawImage(this,pos,(QImage *)pQVar4);
        return;
      }
      goto LAB_003735ea;
    }
    pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar6 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar6 = (QPaintEngineState *)0x0;
    }
    TVar3 = QTransform::type((QTransform *)(pQVar6 + 0x36));
    if (1 < (int)TVar3) {
      QVar7 = QPen::color((QPen *)(pQVar6 + 0x10));
      local_48._0_8_ = QVar7._0_8_;
      local_48._8_6_ = QVar7.ct._4_6_;
      QRasterBuffer::colorizeBitmap((QImage *)local_78,pQVar5,(QImage *)pQVar4,(QColor *)local_48);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x2c])(this,pos,local_78)
      ;
      goto LAB_00373585;
    }
    ensurePen(this);
    local_78._0_8_ = pos->xp + *(double *)(pQVar6 + 0x42);
    local_78._8_8_ = pos->yp + *(double *)(pQVar6 + 0x44);
    drawBitmap(this,(QPointF *)local_78,(QImage *)pQVar4,(QSpanData *)(pQVar6 + 0x72));
  }
  else {
    local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = (QRasterBuffer *)pixmap;
    QPixmap::toImage((QImage *)local_78,pixmap);
    iVar2 = QPixmap::depth(pixmap);
    if (iVar2 == 1) {
      pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar6 = pQVar1 + -2;
      if (pQVar1 == (QPaintEngineState *)0x0) {
        pQVar6 = (QPaintEngineState *)0x0;
      }
      TVar3 = QTransform::type((QTransform *)(pQVar6 + 0x36));
      if ((int)TVar3 < 2) {
        ensurePen(this);
        local_48._0_8_ = pos->xp + *(double *)(pQVar6 + 0x42);
        local_48._8_8_ = pos->yp + *(double *)(pQVar6 + 0x44);
        drawBitmap(this,(QPointF *)local_48,(QImage *)local_78,(QSpanData *)(pQVar6 + 0x72));
      }
      else {
        QVar7 = QPen::color((QPen *)(pQVar6 + 0x10));
        local_58._0_8_ = QVar7._0_8_;
        local_58.ct._4_4_ = QVar7.ct._4_4_;
        local_58.ct.argb.pad = QVar7.ct._8_2_;
        QRasterBuffer::colorizeBitmap((QImage *)local_48,pQVar5,(QImage *)local_78,&local_58);
        (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x2c])
                  (this,pos,(QImage *)local_48);
        QImage::~QImage((QImage *)local_48);
      }
    }
    else {
      drawImage(this,pos,(QImage *)local_78);
    }
LAB_00373585:
    QImage::~QImage((QImage *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_003735ea:
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QPointF &pos, const QPixmap &pixmap)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), pos=" << pos << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    } else {
        const QImage image = pixmap.toImage();
        if (pixmap.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    }
}